

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::hufEncode(longlong *hcode,unsigned_short *in,int ni,int rlc,char *out)

{
  ushort uVar1;
  int in_EDX;
  ushort *in_RSI;
  longlong *in_R8;
  int i;
  int cs;
  int s;
  int lc;
  longlong c;
  char *outStart;
  int local_40;
  int local_3c;
  uint uVar2;
  int iVar3;
  int *lc_00;
  longlong *runCode;
  
  lc_00 = (int *)0x0;
  iVar3 = 0;
  uVar1 = *in_RSI;
  local_3c = 0;
  runCode = in_R8;
  for (local_40 = 1; uVar2 = (uint)uVar1, local_40 < in_EDX; local_40 = local_40 + 1) {
    if ((uVar2 == in_RSI[local_40]) && (local_3c < 0xff)) {
      local_3c = local_3c + 1;
    }
    else {
      sendCode((longlong)in_RSI,in_EDX,(longlong)runCode,in_R8,lc_00,(char **)CONCAT44(iVar3,uVar2))
      ;
      local_3c = 0;
    }
    uVar1 = in_RSI[local_40];
  }
  sendCode((longlong)in_RSI,in_EDX,(longlong)runCode,in_R8,lc_00,(char **)CONCAT44(iVar3,uVar2));
  if (iVar3 != 0) {
    *(char *)runCode = (char)((long)lc_00 << (8U - (char)iVar3 & 0x3f));
  }
  return ((int)runCode - (int)in_R8) * 8 + iVar3;
}

Assistant:

int hufEncode                   // return: output size (in bits)
    (const long long *hcode,    // i : encoding table
     const unsigned short *in,  // i : uncompressed input buffer
     const int ni,              // i : input buffer size (in bytes)
     int rlc,                   // i : rl code
     char *out)                 //  o: compressed output buffer
{
  char *outStart = out;
  long long c = 0;  // bits not yet written to out
  int lc = 0;       // number of valid bits in c (LSB)
  int s = in[0];
  int cs = 0;

  //
  // Loop on input values
  //

  for (int i = 1; i < ni; i++) {
    //
    // Count same values or send code
    //

    if (s == in[i] && cs < 255) {
      cs++;
    } else {
      sendCode(hcode[s], cs, hcode[rlc], c, lc, out);
      cs = 0;
    }

    s = in[i];
  }

  //
  // Send remaining code
  //

  sendCode(hcode[s], cs, hcode[rlc], c, lc, out);

  if (lc) *out = (c << (8 - lc)) & 0xff;

  return (out - outStart) * 8 + lc;
}